

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O2

void __thiscall gdscpp::push_back_STR(gdscpp *this,gdsSTR *target_structure)

{
  pointer pgVar1;
  pointer pgVar2;
  size_type sVar3;
  __hashtable *__h;
  string asStack_48 [32];
  int local_28;
  
  sVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(&(this->STR_Lookup)._M_h,&target_structure->name);
  if (sVar3 == 0) {
    std::vector<gdsSTR,_std::allocator<gdsSTR>_>::push_back(&this->STR,target_structure);
    pgVar1 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pgVar2 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
             super__Vector_impl_data._M_start;
    std::__cxx11::string::string(asStack_48,(string *)target_structure);
    local_28 = (int)(((long)pgVar1 - (long)pgVar2) / 0xf8) + -1;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string_const,int>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->STR_Lookup,asStack_48);
    std::__cxx11::string::~string(asStack_48);
  }
  return;
}

Assistant:

void gdscpp::push_back_STR(gdsSTR target_structure)
{
  if (!STR_Lookup.count(target_structure.name)) // if doesn't already exist
  {
    STR.push_back(target_structure);
    STR_Lookup.insert({target_structure.name, (STR.size() - 1)});
  }
}